

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

int Abc_SclIsInv(Abc_Obj_t *pObj)

{
  int iVar1;
  word wVar2;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsNode(pObj);
  if (iVar1 != 0) {
    wVar2 = Mio_GateReadTruth((Mio_Gate_t *)(pObj->field_5).pData);
    return (int)(wVar2 == 0x5555555555555555);
  }
  __assert_fail("Abc_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclBuffer.c"
                ,0x76,"int Abc_SclIsInv(Abc_Obj_t *)");
}

Assistant:

int Abc_SclIsInv( Abc_Obj_t * pObj )
{
    assert( Abc_ObjIsNode(pObj) );
    return Mio_GateReadTruth((Mio_Gate_t *)pObj->pData) == ABC_CONST(0x5555555555555555);
}